

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O0

int streamStateAlloc(roslz4_stream *str)

{
  undefined4 *__ptr;
  void *pvVar1;
  long in_RDI;
  stream_state *state;
  int local_4;
  
  __ptr = (undefined4 *)malloc(0x58);
  if (__ptr == (undefined4 *)0x0) {
    local_4 = -5;
  }
  else {
    *(undefined4 **)(in_RDI + 0x28) = __ptr;
    *(undefined4 *)(in_RDI + 0x24) = 0xffffffff;
    *__ptr = 1;
    __ptr[1] = 0;
    __ptr[2] = 1;
    __ptr[8] = 0;
    pvVar1 = XXH32_init((U32)((ulong)__ptr >> 0x20));
    *(void **)(__ptr + 10) = pvVar1;
    if (*(long *)(__ptr + 10) == 0) {
      if (*(long *)(__ptr + 4) != 0) {
        free(*(void **)(__ptr + 4));
      }
      free(__ptr);
      *(undefined8 *)(in_RDI + 0x28) = 0;
      local_4 = -5;
    }
    else {
      __ptr[0x13] = 0;
      __ptr[0x14] = 0;
      __ptr[0xc] = 0;
      __ptr[7] = 0;
      __ptr[6] = 0;
      *(undefined8 *)(__ptr + 4) = 0;
      __ptr[0x10] = 0;
      __ptr[0x11] = 0;
      __ptr[0x12] = 0;
      *(undefined4 *)(in_RDI + 0x1c) = 0;
      *(undefined4 *)(in_RDI + 0x20) = 0;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int streamStateAlloc(roslz4_stream *str) {
  stream_state *state = (stream_state*) malloc(sizeof(stream_state));
  if (state == NULL) {
    return ROSLZ4_MEMORY_ERROR; // Allocation of state failed
  }
  str->state = state;

  str->block_size_id = -1;
  state->block_independence_flag = 1;
  state->block_checksum_flag = 0;
  state->stream_checksum_flag = 1;

  state->finished = 0;

  state->xxh32_state = XXH32_init(0);
  if (state->xxh32_state == NULL) {
    if (state->buffer != NULL) {
      free(state->buffer);
    }
    free(state);
    str->state = NULL;
    return ROSLZ4_MEMORY_ERROR; // Allocation failed
  }
  state->stream_checksum = 0;
  state->stream_checksum_read = 0;

  state->wrote_header = 0;

  state->buffer_offset = 0;
  state->buffer_size = 0;
  state->buffer = NULL;

  state->block_size = 0;
  state->block_size_read = 0;
  state->block_uncompressed = 0;

  str->total_in = 0;
  str->total_out = 0;

  return ROSLZ4_OK;
}